

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerStElemI
          (Lowerer *this,Instr *instr,PropertyOperationFlags flags,bool isHelper,
          JnHelperMethod helperMethod)

{
  LowererMD *this_00;
  IRType IVar1;
  Instr *pIVar2;
  Opnd *this_01;
  Opnd *opndArg;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BailOutKind BVar6;
  BailOutKind BVar7;
  JnHelperMethod JVar8;
  undefined4 *puVar9;
  JitProfilingInstr *instr_00;
  IndirOpnd *pIVar10;
  LabelInstr *target;
  IntConstOpnd *opndArg_00;
  RegOpnd *opndArg_01;
  IRType IVar11;
  uint lineNumber;
  AddrOpnd *local_68;
  RegOpnd *local_60;
  
  pIVar2 = instr->m_prev;
  if (instr->m_kind == InstrKindJitProfiling) {
    if (isHelper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x2394,"(!isHelper)","!isHelper");
      if (!bVar4) goto LAB_005543ee;
      *puVar9 = 0;
    }
    instr_00 = IR::Instr::AsJitProfilingInstr(instr);
    LowerProfiledStElemI(this,instr_00,flags);
    return pIVar2;
  }
  this_01 = instr->m_dst;
  opndArg = instr->m_src1;
  IVar1 = opndArg->m_type;
  bVar4 = IR::Opnd::IsIndirOpnd(this_01);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x239e,"(dst->IsIndirOpnd())","Expected indirOpnd on StElementI");
    if (!bVar4) goto LAB_005543ee;
    *puVar9 = 0;
  }
  pIVar10 = IR::Opnd::AsIndirOpnd(this_01);
  bVar4 = pIVar10->m_conversionAllowed;
  if ((instr->field_0x38 & 0x10) == 0) {
    local_60 = (RegOpnd *)0x0;
  }
  else {
    BVar6 = IR::Instr::GetBailOutKind(instr);
    if ((BVar6 >> 0x12 & 1) == 0) {
      if ((BVar6 >> 0xe & 1) != 0) {
        LowerBailOnCreatedMissingValue(this,instr,isHelper);
        BVar6 = BVar6 & ~(BailOutOnInvalidatedArrayHeadSegment|BailOutOnMissingValue);
        if (BVar6 == BailOutInvalid) goto LAB_0055401f;
        BVar7 = IR::Instr::GetBailOutKind(instr);
        if (BVar7 != BVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          lineNumber = 0x23c6;
          goto LAB_00553f88;
        }
      }
LAB_00553f9a:
      if ((BVar6 >> 0x13 & 1) != 0) {
        LowerBailOnInvalidatedArrayLength(this,instr,isHelper);
        BVar6 = BVar6 & ~(BailOutOnInvalidatedArrayLength|BailOutOnInvalidatedArrayHeadSegment);
        if (BVar6 == BailOutInvalid) goto LAB_0055401f;
        BVar7 = IR::Instr::GetBailOutKind(instr);
        if (BVar7 != BVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x23cc,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar5) goto LAB_005543ee;
          *puVar9 = 0;
        }
      }
      if ((BVar6 >> 0x10 & 1) != 0) {
        target = IR::LabelInstr::New(Label,this->m_func,isHelper);
        IR::Instr::InsertAfter(instr,&target->super_Instr);
        LowerOneBailOutKind(this,instr,BailOutConvertedNativeArray,false,false);
        local_60 = IR::RegOpnd::New(TyInt64,this->m_func);
        InsertTestBranch(&local_60->super_Opnd,&local_60->super_Opnd,BrEq_A,target,instr->m_next);
        goto LAB_00554084;
      }
    }
    else {
      if ((BVar6 >> 0xe & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x23bd,"(!(bailOutKind & IR::BailOutOnMissingValue))",
                           "!(bailOutKind & IR::BailOutOnMissingValue)");
        if (!bVar5) goto LAB_005543ee;
        *puVar9 = 0;
      }
      LowerBailOnInvalidatedArrayHeadSegment(this,instr,isHelper);
      BVar6 = BVar6 & ~BailOutOnInvalidatedArrayHeadSegment;
      if (BVar6 != BailOutInvalid) {
        BVar7 = IR::Instr::GetBailOutKind(instr);
        if (BVar7 != BVar6) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar9 = 1;
          lineNumber = 0x23c0;
LAB_00553f88:
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,lineNumber,"(!bailOutKind || instr->GetBailOutKind() == bailOutKind)",
                             "!bailOutKind || instr->GetBailOutKind() == bailOutKind");
          if (!bVar5) goto LAB_005543ee;
          *puVar9 = 0;
        }
        goto LAB_00553f9a;
      }
    }
LAB_0055401f:
    local_60 = (RegOpnd *)0x0;
  }
LAB_00554084:
  IR::Instr::UnlinkDst(instr);
  IR::Instr::UnlinkSrc1(instr);
  if (((0x1a < helperMethod - HelperOp_InitClassMemberSetComputedName) ||
      ((0x400000dU >> (helperMethod - HelperOp_InitClassMemberSetComputedName & 0x1f) & 1) == 0)) &&
     ((3 < helperMethod - HelperOP_InitElemSetter || (helperMethod - HelperOP_InitElemSetter == 1)))
     ) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x23e3,
                       "(helperMethod == IR::HelperOP_InitElemGetter || helperMethod == IR::HelperOP_InitElemSetter || helperMethod == IR::HelperOP_InitComputedProperty || helperMethod == IR::HelperOp_SetElementI || helperMethod == IR::HelperOp_InitClassMemberComputedName || helperMethod == IR::HelperOp_InitClassMemberGetComputedName || helperMethod == IR::HelperOp_InitClassMemberSetComputedName)"
                       ,
                       "helperMethod == IR::HelperOP_InitElemGetter || helperMethod == IR::HelperOP_InitElemSetter || helperMethod == IR::HelperOP_InitComputedProperty || helperMethod == IR::HelperOp_SetElementI || helperMethod == IR::HelperOp_InitClassMemberComputedName || helperMethod == IR::HelperOp_InitClassMemberGetComputedName || helperMethod == IR::HelperOp_InitClassMemberSetComputedName"
                      );
    if (!bVar5) goto LAB_005543ee;
    *puVar9 = 0;
  }
  pIVar10 = IR::Opnd::AsIndirOpnd(this_01);
  local_68 = (AddrOpnd *)IR::IndirOpnd::UnlinkIndexOpnd(pIVar10);
  if (local_68 == (AddrOpnd *)0x0) {
    pIVar10 = IR::Opnd::AsIndirOpnd(this_01);
    local_68 = IR::AddrOpnd::NewFromNumber((long)pIVar10->m_offset,this->m_func,false);
LAB_0055420f:
    if (IVar1 != TyVar) {
      if (IVar1 == TyInt32) {
        JVar8 = HelperOp_SetNativeIntElementI;
        helperMethod = HelperOp_SetNativeIntElementI_NoConvert;
        goto LAB_00554236;
      }
      JVar8 = HelperOp_SetNativeFloatElementI;
      helperMethod = HelperOp_SetNativeFloatElementI_NoConvert;
LAB_00554250:
      if (bVar4 != false) {
        helperMethod = JVar8;
      }
LAB_005542d1:
      if (IVar1 == TyFloat64) {
        LowererMD::LoadDoubleHelperArgument(&this->m_lowererMD,instr,opndArg);
        bVar4 = true;
        goto LAB_00554303;
      }
    }
  }
  else {
    IVar11 = (local_68->super_Opnd).m_type;
    if (IVar11 == TyVar) goto LAB_0055420f;
    if ((((helperMethod == HelperOp_InitClassMemberSetComputedName) ||
         (helperMethod == HelperOp_InitClassMemberGetComputedName)) ||
        (helperMethod == HelperOP_InitElemGetter)) || (helperMethod == HelperOP_InitElemSetter)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x23f0,
                         "(helperMethod != IR::HelperOP_InitElemGetter && helperMethod != IR::HelperOP_InitElemSetter && helperMethod != IR::HelperOp_InitClassMemberGetComputedName && helperMethod != IR::HelperOp_InitClassMemberSetComputedName)"
                         ,
                         "helperMethod != IR::HelperOP_InitElemGetter && helperMethod != IR::HelperOP_InitElemSetter && helperMethod != IR::HelperOp_InitClassMemberGetComputedName && helperMethod != IR::HelperOp_InitClassMemberSetComputedName"
                        );
      if (!bVar5) goto LAB_005543ee;
      *puVar9 = 0;
      IVar11 = (local_68->super_Opnd).m_type;
    }
    if (IVar11 == TyUint32) {
      if (IVar1 != TyVar) {
        if (IVar1 == TyInt32) {
          JVar8 = HelperOp_SetNativeIntElementI_UInt32;
          helperMethod = HelperOp_SetNativeIntElementI_UInt32_NoConvert;
          goto LAB_00554236;
        }
        JVar8 = HelperOp_SetNativeFloatElementI_UInt32;
        helperMethod = HelperOp_SetNativeFloatElementI_UInt32_NoConvert;
        goto LAB_00554250;
      }
      helperMethod = HelperOp_SetElementI_UInt32;
    }
    else {
      if (IVar11 != TyInt32) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x2404,"(0)","FALSE");
        if (!bVar4) {
LAB_005543ee:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar9 = 0;
        goto LAB_005542d1;
      }
      if (IVar1 == TyVar) {
        helperMethod = HelperOp_SetElementI_Int32;
        goto LAB_00554301;
      }
      if (IVar1 != TyInt32) {
        JVar8 = HelperOp_SetNativeFloatElementI_Int32;
        helperMethod = HelperOp_SetNativeFloatElementI_Int32_NoConvert;
        goto LAB_00554250;
      }
      JVar8 = HelperOp_SetNativeIntElementI_Int32;
      helperMethod = HelperOp_SetNativeIntElementI_Int32_NoConvert;
LAB_00554236:
      if (bVar4 != false) {
        helperMethod = JVar8;
      }
    }
  }
LAB_00554301:
  bVar4 = false;
LAB_00554303:
  this_00 = &this->m_lowererMD;
  opndArg_00 = IR::IntConstOpnd::New((long)(int)flags,TyInt32,this->m_func,true);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg_00->super_Opnd);
  LoadScriptContext(this,instr);
  if (!bVar4) {
    LowererMD::LoadHelperArgument(this_00,instr,opndArg);
  }
  LowererMD::LoadHelperArgument(this_00,instr,&local_68->super_Opnd);
  pIVar10 = IR::Opnd::AsIndirOpnd(this_01);
  opndArg_01 = IR::IndirOpnd::UnlinkBaseOpnd(pIVar10);
  LowererMD::LoadHelperArgument(this_00,instr,&opndArg_01->super_Opnd);
  IR::Opnd::Free(this_01,this->m_func);
  if (local_60 != (RegOpnd *)0x0) {
    IR::Instr::SetDst(instr,&local_60->super_Opnd);
  }
  LowererMD::ChangeToHelperCall
            (this_00,instr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             isHelper);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerStElemI(IR::Instr * instr, Js::PropertyOperationFlags flags, bool isHelper, IR::JnHelperMethod helperMethod)
{
    IR::Instr *instrPrev = instr->m_prev;

    if (instr->IsJitProfilingInstr())
    {
        Assert(!isHelper);
        LowerProfiledStElemI(instr->AsJitProfilingInstr(), flags);
        return instrPrev;
    }

    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *dst = instr->GetDst();
    IR::Opnd *newDst = nullptr;
    IRType srcType = src1->GetType();

    AssertMsg(dst->IsIndirOpnd(), "Expected indirOpnd on StElementI");

    bool allowConvert = dst->AsIndirOpnd()->ConversionAllowed();

#if !FLOATVAR
    if (dst->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyOptimizedTypedArray() && src1->IsRegOpnd())
    {
        // We allow the source of typedArray StElem to be marked as temp, since we just need the value,
        // however if the array turns out to be a non-typed array, or the index isn't valid (the value is then stored as a property)
        // the temp needs to be boxed if it is a float.  The BoxStackNumber helper will box JavascriptNumbers
        // which are on the stack.

        // regVar = BoxStackNumber(src1, scriptContext)
        IR::Instr *newInstr = IR::Instr::New(Js::OpCode::Call, this->m_func);
        IR::RegOpnd *regVar = IR::RegOpnd::New(TyVar, this->m_func);
        newInstr->SetDst(regVar);
        newInstr->SetSrc1(src1);
        instr->InsertBefore(newInstr);
        LowerUnaryHelperMem(newInstr, IR::HelperBoxStackNumber);

        // MOV src1, regVar
        newInstr = IR::Instr::New(Js::OpCode::Ld_A, src1, regVar, this->m_func);
        instr->InsertBefore(m_lowererMD.ChangeToAssign(newInstr));
    }
#endif

    if(instr->HasBailOutInfo())
    {
        IR::BailOutKind bailOutKind = instr->GetBailOutKind();
        if(bailOutKind & IR::BailOutOnInvalidatedArrayHeadSegment)
        {
            Assert(!(bailOutKind & IR::BailOutOnMissingValue));
            LowerBailOnInvalidatedArrayHeadSegment(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayHeadSegment;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        else if(bailOutKind & IR::BailOutOnMissingValue)
        {
            LowerBailOnCreatedMissingValue(instr, isHelper);
            bailOutKind ^= IR::BailOutOnMissingValue;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        if(bailOutKind & IR::BailOutOnInvalidatedArrayLength)
        {
            LowerBailOnInvalidatedArrayLength(instr, isHelper);
            bailOutKind ^= IR::BailOutOnInvalidatedArrayLength;
            Assert(!bailOutKind || instr->GetBailOutKind() == bailOutKind);
        }
        if(bailOutKind & IR::BailOutConvertedNativeArray)
        {
            IR::LabelInstr *labelSkipBailOut = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
            instr->InsertAfter(labelSkipBailOut);
            LowerOneBailOutKind(instr, IR::BailOutConvertedNativeArray, isHelper);
            newDst = IR::RegOpnd::New(TyMachReg, m_func);
            InsertTestBranch(newDst, newDst, Js::OpCode::BrEq_A, labelSkipBailOut, instr->m_next);
        }
    }

    instr->UnlinkDst();
    instr->UnlinkSrc1();

    Assert(
        helperMethod == IR::HelperOP_InitElemGetter ||
        helperMethod == IR::HelperOP_InitElemSetter ||
        helperMethod == IR::HelperOP_InitComputedProperty ||
        helperMethod == IR::HelperOp_SetElementI ||
        helperMethod == IR::HelperOp_InitClassMemberComputedName ||
        helperMethod == IR::HelperOp_InitClassMemberGetComputedName ||
        helperMethod == IR::HelperOp_InitClassMemberSetComputedName
        );

    IR::IndirOpnd* dstIndirOpnd = dst->AsIndirOpnd();

    IR::Opnd *indexOpnd = dstIndirOpnd->UnlinkIndexOpnd();

    if (indexOpnd && indexOpnd->GetType() != TyVar)
    {
        Assert(
            helperMethod != IR::HelperOP_InitElemGetter &&
            helperMethod != IR::HelperOP_InitElemSetter &&
            helperMethod != IR::HelperOp_InitClassMemberGetComputedName &&
            helperMethod != IR::HelperOp_InitClassMemberSetComputedName
        );

        if (indexOpnd->GetType() == TyInt32)
        {
            helperMethod =
                srcType == TyVar ? IR::HelperOp_SetElementI_Int32 :
                srcType == TyInt32 ? 
                    (allowConvert ? IR::HelperOp_SetNativeIntElementI_Int32 : IR::HelperOp_SetNativeIntElementI_Int32_NoConvert) :
                    (allowConvert ? IR::HelperOp_SetNativeFloatElementI_Int32 : IR::HelperOp_SetNativeFloatElementI_Int32_NoConvert) ;
        }
        else if (indexOpnd->GetType() == TyUint32)
        {
            helperMethod =
                srcType == TyVar ? IR::HelperOp_SetElementI_UInt32 :
                srcType == TyInt32 ? 
                    (allowConvert ? IR::HelperOp_SetNativeIntElementI_UInt32 : IR::HelperOp_SetNativeIntElementI_UInt32_NoConvert) :
                    (allowConvert ? IR::HelperOp_SetNativeFloatElementI_UInt32 : IR::HelperOp_SetNativeFloatElementI_UInt32_NoConvert) ;
        }
        else
        {
            Assert(FALSE);
        }
    }
    else
    {
        if (indexOpnd == nullptr)
        {
            // No index; the offset identifies the element.
            IntConstType offset = (IntConstType)dst->AsIndirOpnd()->GetOffset();
            indexOpnd = IR::AddrOpnd::NewFromNumber(offset, m_func);
        }

        if (srcType != TyVar)
        {
            helperMethod = srcType == TyInt32 ? 
                (allowConvert ? IR::HelperOp_SetNativeIntElementI : IR::HelperOp_SetNativeIntElementI_NoConvert) : 
                (allowConvert ? IR::HelperOp_SetNativeFloatElementI : IR::HelperOp_SetNativeFloatElementI_NoConvert);
        }
    }

    if (srcType == TyFloat64)
    {
        m_lowererMD.LoadDoubleHelperArgument(instr, src1);
    }
    m_lowererMD.LoadHelperArgument(instr,
        IR::IntConstOpnd::New(static_cast<IntConstType>(flags), IRType::TyInt32, m_func, true));
    LoadScriptContext(instr);
    if (srcType != TyFloat64)
    {
        m_lowererMD.LoadHelperArgument(instr, src1);
    }
    m_lowererMD.LoadHelperArgument(instr, indexOpnd);

    IR::Opnd *baseOpnd = dst->AsIndirOpnd()->UnlinkBaseOpnd();
    m_lowererMD.LoadHelperArgument(instr, baseOpnd);

    dst->Free(this->m_func);
    if (newDst)
    {
        instr->SetDst(newDst);
    }

    m_lowererMD.ChangeToHelperCall(instr, helperMethod, nullptr, nullptr, nullptr, isHelper);

    return instrPrev;
}